

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O3

sz_sock sznet::net::sockets::sz_sock_create(int family)

{
  int iVar1;
  SourceFile file;
  Logger local_fe0;
  
  iVar1 = socket(family,1,6);
  if (iVar1 < 0) {
    file._8_8_ = 0xe;
    file.m_data = "SocketsOps.cpp";
    Logger::Logger(&local_fe0,file,0x14b,true);
    if (0x17 < (uint)(((int)&local_fe0 + 0xfb0) - (int)local_fe0.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_fe0.m_impl.m_stream.m_buffer.m_cur,"sockets::sz_sock_create",0x17);
      local_fe0.m_impl.m_stream.m_buffer.m_cur = local_fe0.m_impl.m_stream.m_buffer.m_cur + 0x17;
    }
    Logger::~Logger(&local_fe0);
  }
  return iVar1;
}

Assistant:

sz_sock sz_sock_create(int family)
{
	sz_sock sockfd = ::socket(family, SOCK_STREAM, IPPROTO_TCP);
	if (sockfd < 0)
	{
		LOG_SYSFATAL << "sockets::sz_sock_create";
	}

	return sockfd;
}